

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imap.c
# Opt level: O3

CURLcode imap_block_statemach(connectdata *conn,_Bool disconnecting)

{
  CURLcode CVar1;
  
  if ((conn->proto).imapc.state == IMAP_STOP) {
    return CURLE_OK;
  }
  do {
    CVar1 = Curl_pp_statemach(&(conn->proto).ftpc.pp,true,disconnecting);
    if ((conn->proto).imapc.state == IMAP_STOP) {
      return CVar1;
    }
  } while (CVar1 == CURLE_OK);
  return CVar1;
}

Assistant:

static CURLcode imap_block_statemach(struct connectdata *conn,
                                     bool disconnecting)
{
  CURLcode result = CURLE_OK;
  struct imap_conn *imapc = &conn->proto.imapc;

  while(imapc->state != IMAP_STOP && !result)
    result = Curl_pp_statemach(&imapc->pp, TRUE, disconnecting);

  return result;
}